

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_ecmult_multi(secp256k1_scratch *scratch,secp256k1_ecmult_multi_func ecmult_multi)

{
  ulong uVar1;
  size_t sVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  secp256k1_scalar *psVar15;
  ulong uVar16;
  ulong uVar17;
  secp256k1_ge *psVar18;
  secp256k1_gej *psVar19;
  secp256k1_gej *psVar20;
  uint64_t *puVar21;
  secp256k1_ge *psVar22;
  uint64_t *puVar23;
  char *pcVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  byte bVar28;
  ecmult_multi_data data;
  secp256k1_gej r;
  secp256k1_gej ptgj;
  secp256k1_scalar t1;
  secp256k1_scalar t0;
  secp256k1_scalar sc [32];
  secp256k1_gej r2;
  secp256k1_scalar tmp2;
  secp256k1_scalar tmp1;
  secp256k1_ge ptg;
  secp256k1_scalar rs;
  secp256k1_ge ptg_4;
  secp256k1_gej actual;
  secp256k1_gej expected;
  secp256k1_ge pt [32];
  
  bVar28 = 0;
  data.sc = sc;
  data.pt = pt;
  iVar25 = 0;
  iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,(secp256k1_scalar *)0x0,
                          ecmult_multi_callback,&data,0);
  if (iVar6 == 0) {
    pcVar24 = 
    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0)"
    ;
    uVar11 = 0x1238;
  }
  else {
    for (; iVar25 < COUNT; iVar25 = iVar25 + 1) {
      testutil_random_scalar_order(sc);
      testutil_random_scalar_order(sc + 1);
      testutil_random_ge_test(&ptg);
      secp256k1_gej_set_ge(&ptgj,&ptg);
      lVar8 = 0xd;
      psVar18 = &ptg;
      psVar22 = pt;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        (psVar22->x).n[0] = (psVar18->x).n[0];
        psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
        psVar22 = (secp256k1_ge *)((long)psVar22 + (ulong)bVar28 * -0x10 + 8);
      }
      psVar18 = &secp256k1_ge_const_g;
      psVar22 = pt + 1;
      for (; lVar8 != 0; lVar8 = lVar8 + -1) {
        (psVar22->x).n[0] = (psVar18->x).n[0];
        psVar18 = (secp256k1_ge *)((long)psVar18 + ((ulong)bVar28 * -2 + 1) * 8);
        psVar22 = (secp256k1_ge *)((long)psVar22 + (ulong)bVar28 * -0x10 + 8);
      }
      secp256k1_ecmult(&r2,&ptgj,&secp256k1_scalar_zero,sc);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,sc,ecmult_multi_callback,&data,0);
      if (iVar6 == 0) {
        pcVar24 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0)"
        ;
        uVar11 = 0x1248;
        goto LAB_0013c255;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar24 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar11 = 0x1249;
        goto LAB_0013c255;
      }
      secp256k1_ecmult(&r2,&ptgj,sc,&secp256k1_scalar_zero);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&data,1);
      if (iVar6 == 0) {
        pcVar24 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1)"
        ;
        uVar11 = 0x124d;
        goto LAB_0013c255;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar24 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar11 = 0x124e;
        goto LAB_0013c255;
      }
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_false_callback,&data,1);
      if (iVar6 != 0) {
        pcVar24 = 
        "test condition failed: !ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1)"
        ;
        uVar11 = 0x1251;
        goto LAB_0013c255;
      }
      secp256k1_ecmult(&r2,&ptgj,sc,sc + 1);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&data,2);
      if (iVar6 == 0) {
        pcVar24 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2)"
        ;
        uVar11 = 0x1255;
        goto LAB_0013c255;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar24 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar11 = 0x1256;
        goto LAB_0013c255;
      }
      secp256k1_ecmult(&r2,&ptgj,sc,sc + 1);
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,sc + 1,ecmult_multi_callback,&data,1);
      if (iVar6 == 0) {
        pcVar24 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1)"
        ;
        uVar11 = 0x125a;
        goto LAB_0013c255;
      }
      iVar6 = secp256k1_gej_eq_var(&r,&r2);
      if (iVar6 == 0) {
        pcVar24 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
        uVar11 = 0x125b;
        goto LAB_0013c255;
      }
    }
    lVar8 = 0xd;
    for (iVar6 = 0; iVar6 < COUNT; iVar6 = iVar6 + 1) {
      lVar7 = 0;
      while (lVar7 != 3) {
        psVar18 = pt;
        for (lVar14 = 0; lVar14 != 0x400; lVar14 = lVar14 + 0x20) {
          testutil_random_scalar_order((secp256k1_scalar *)((long)sc[0].d + lVar14));
          secp256k1_ge_set_infinity(psVar18);
          psVar18 = psVar18 + 1;
        }
        iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,(&DAT_0016e690)[lVar7]);
        if (iVar25 == 0) {
          pcVar24 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar11 = 0x1269;
          goto LAB_0013c255;
        }
        iVar25 = secp256k1_gej_is_infinity(&r);
        lVar7 = lVar7 + 1;
        if (iVar25 == 0) {
          pcVar24 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar11 = 0x126a;
          goto LAB_0013c255;
        }
      }
      lVar7 = 0;
      while (lVar7 != 3) {
        psVar15 = sc;
        for (lVar14 = 0; lVar14 != 0xd00; lVar14 = lVar14 + 0x68) {
          testutil_random_ge_test((secp256k1_ge *)&ptgj);
          psVar20 = &ptgj;
          puVar23 = (uint64_t *)((long)pt[0].x.n + lVar14);
          for (lVar9 = lVar8; lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar23 = (psVar20->x).n[0];
            psVar20 = (secp256k1_gej *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
            puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
          }
          secp256k1_scalar_set_int(psVar15,0);
          psVar15 = psVar15 + 1;
        }
        iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,(&DAT_0016e690)[lVar7]);
        if (iVar25 == 0) {
          pcVar24 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar11 = 0x1273;
          goto LAB_0013c255;
        }
        iVar25 = secp256k1_gej_is_infinity(&r);
        lVar7 = lVar7 + 1;
        if (iVar25 == 0) {
          pcVar24 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar11 = 0x1274;
          goto LAB_0013c255;
        }
      }
      lVar7 = 0;
      while (testutil_random_ge_test((secp256k1_ge *)&ptgj), lVar7 != 3) {
        psVar15 = sc;
        for (lVar14 = 0x68; lVar14 != 0xd68; lVar14 = lVar14 + 0xd0) {
          testutil_random_scalar_order(psVar15);
          secp256k1_scalar_negate(psVar15 + 1,psVar15);
          puVar23 = (uint64_t *)((long)pt[0].x.n + lVar14);
          psVar20 = &ptgj;
          puVar21 = (uint64_t *)((long)expected.y.n + lVar14);
          for (lVar9 = lVar8; lVar10 = lVar8, psVar19 = &ptgj, lVar9 != 0; lVar9 = lVar9 + -1) {
            *puVar21 = (psVar20->x).n[0];
            psVar20 = (secp256k1_gej *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
            puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
          }
          for (; lVar10 != 0; lVar10 = lVar10 + -1) {
            *puVar23 = (psVar19->x).n[0];
            psVar19 = (secp256k1_gej *)((long)psVar19 + (ulong)bVar28 * -0x10 + 8);
            puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
          }
          psVar15 = psVar15 + 2;
        }
        sVar2 = (&DAT_0016e690)[lVar7];
        iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,sVar2);
        if (iVar25 == 0) {
          pcVar24 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar11 = 0x1280;
          goto LAB_0013c255;
        }
        iVar25 = secp256k1_gej_is_infinity(&r);
        if (iVar25 == 0) {
          pcVar24 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar11 = 0x1281;
          goto LAB_0013c255;
        }
        testutil_random_scalar_order(sc);
        psVar18 = pt;
        for (lVar14 = 0x20; lVar14 != 0x420; lVar14 = lVar14 + 0x40) {
          testutil_random_ge_test((secp256k1_ge *)&ptgj);
          uVar4 = sc[0].d[3];
          uVar3 = sc[0].d[1];
          *(uint64_t *)((long)t0.d + lVar14 + 0x10) = sc[0].d[2];
          *(uint64_t *)((long)t0.d + lVar14 + 0x18) = uVar4;
          *(uint64_t *)((long)t0.d + lVar14) = sc[0].d[0];
          *(uint64_t *)((long)t0.d + lVar14 + 8) = uVar3;
          *(uint64_t *)((long)sc[0].d + lVar14) = sc[0].d[0];
          *(uint64_t *)((long)sc[0].d + lVar14 + 8) = sc[0].d[1];
          *(uint64_t *)((long)sc[0].d + lVar14 + 0x10) = sc[0].d[2];
          *(uint64_t *)((long)sc[0].d + lVar14 + 0x18) = sc[0].d[3];
          psVar20 = &ptgj;
          psVar22 = psVar18;
          for (lVar9 = lVar8; lVar9 != 0; lVar9 = lVar9 + -1) {
            (psVar22->x).n[0] = (psVar20->x).n[0];
            psVar20 = (secp256k1_gej *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
            psVar22 = (secp256k1_ge *)((long)psVar22 + (ulong)bVar28 * -0x10 + 8);
          }
          secp256k1_ge_neg(psVar18 + 1,psVar18);
          psVar18 = psVar18 + 2;
        }
        iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                                 ecmult_multi_callback,&data,sVar2);
        if (iVar25 == 0) {
          pcVar24 = 
          "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j])"
          ;
          uVar11 = 0x128d;
          goto LAB_0013c255;
        }
        iVar25 = secp256k1_gej_is_infinity(&r);
        lVar7 = lVar7 + 1;
        if (iVar25 == 0) {
          pcVar24 = "test condition failed: secp256k1_gej_is_infinity(&r)";
          uVar11 = 0x128e;
          goto LAB_0013c255;
        }
      }
      secp256k1_scalar_set_int(sc,0);
      psVar20 = &ptgj;
      psVar18 = pt;
      for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
        (psVar18->x).n[0] = (psVar20->x).n[0];
        psVar20 = (secp256k1_gej *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
        psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
      }
      psVar15 = sc;
      for (lVar7 = 0x68; psVar15 = psVar15 + 1, lVar7 != 0xd00; lVar7 = lVar7 + 0x68) {
        psVar20 = &ptgj;
        puVar23 = (uint64_t *)((long)pt[0].x.n + lVar7);
        for (lVar14 = lVar8; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar23 = (psVar20->x).n[0];
          psVar20 = (secp256k1_gej *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
          puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
        }
        testutil_random_scalar_order(psVar15);
        secp256k1_scalar_add(sc,sc,psVar15);
        secp256k1_scalar_negate(psVar15,psVar15);
      }
      iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                               ecmult_multi_callback,&data,0x20);
      if (iVar25 == 0) {
        pcVar24 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32)"
        ;
        uVar11 = 0x129c;
        goto LAB_0013c255;
      }
      iVar25 = secp256k1_gej_is_infinity(&r);
      if (iVar25 == 0) {
        pcVar24 = "test condition failed: secp256k1_gej_is_infinity(&r)";
        uVar11 = 0x129d;
        goto LAB_0013c255;
      }
    }
    iVar6 = 0;
    do {
      if (COUNT <= iVar6) {
        iVar6 = 0;
        goto LAB_0013bc1f;
      }
      secp256k1_gej_set_infinity(&r);
      testutil_random_scalar_order(sc);
      psVar18 = pt;
      for (lVar8 = 0; uVar5 = sc[0].d[3], uVar4 = sc[0].d[2], uVar3 = sc[0].d[1], lVar8 != 0x280;
          lVar8 = lVar8 + 0x20) {
        *(uint64_t *)((long)sc[0].d + lVar8) = sc[0].d[0];
        *(uint64_t *)((long)sc[0].d + lVar8 + 8) = uVar3;
        *(uint64_t *)((long)sc[0].d + lVar8 + 0x10) = uVar4;
        *(uint64_t *)((long)sc[0].d + lVar8 + 0x18) = uVar5;
        testutil_random_ge_test((secp256k1_ge *)&ptgj);
        psVar20 = &ptgj;
        psVar22 = psVar18;
        for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
          (psVar22->x).n[0] = (psVar20->x).n[0];
          psVar20 = (secp256k1_gej *)((long)psVar20 + (ulong)bVar28 * -0x10 + 8);
          psVar22 = (secp256k1_ge *)((long)psVar22 + (ulong)bVar28 * -0x10 + 8);
        }
        secp256k1_gej_add_ge_var(&r,&r,psVar18,(secp256k1_fe *)0x0);
        psVar18 = psVar18 + 1;
      }
      secp256k1_ecmult(&r2,&r,sc,&secp256k1_scalar_zero);
      iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                               ecmult_multi_callback,&data,0x14);
      if (iVar25 == 0) {
        pcVar24 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
        ;
        uVar11 = 0x12af;
        goto LAB_0013c255;
      }
      iVar25 = secp256k1_gej_eq_var(&r,&r2);
      iVar6 = iVar6 + 1;
    } while (iVar25 != 0);
    pcVar24 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
    uVar11 = 0x12b0;
  }
LAB_0013c255:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c",
          uVar11,pcVar24);
  abort();
LAB_0013bc1f:
  if (COUNT <= iVar6) goto LAB_0013bd1e;
  secp256k1_scalar_set_int(&rs,0);
  testutil_random_ge_test(&ptg);
  psVar15 = sc;
  for (lVar8 = 0; lVar8 != 0x820; lVar8 = lVar8 + 0x68) {
    testutil_random_scalar_order(psVar15);
    psVar18 = &ptg;
    puVar23 = (uint64_t *)((long)pt[0].x.n + lVar8);
    for (lVar7 = 0xd; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar23 = (psVar18->x).n[0];
      psVar18 = (secp256k1_ge *)((long)psVar18 + (ulong)bVar28 * -0x10 + 8);
      puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
    }
    secp256k1_scalar_add(&rs,&rs,psVar15);
    psVar15 = psVar15 + 1;
  }
  secp256k1_gej_set_ge(&ptgj,pt);
  secp256k1_ecmult(&r2,&ptgj,&rs,&secp256k1_scalar_zero);
  iVar25 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                           ecmult_multi_callback,&data,0x14);
  if (iVar25 == 0) {
    pcVar24 = 
    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
    ;
    uVar11 = 0x12c4;
    goto LAB_0013c255;
  }
  iVar25 = secp256k1_gej_eq_var(&r,&r2);
  if (iVar25 == 0) {
    pcVar24 = "test condition failed: secp256k1_gej_eq_var(&r, &r2)";
    uVar11 = 0x12c5;
    goto LAB_0013c255;
  }
  iVar6 = iVar6 + 1;
  goto LAB_0013bc1f;
LAB_0013bd1e:
  psVar18 = pt;
  for (lVar8 = 0; lVar8 != 0x280; lVar8 = lVar8 + 0x20) {
    testutil_random_scalar_order((secp256k1_scalar *)((long)sc[0].d + lVar8));
    testutil_random_ge_test(psVar18);
    psVar18 = psVar18 + 1;
  }
  secp256k1_scalar_set_int(sc,0);
  iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                          ecmult_multi_callback,&data,0x14);
  if (iVar6 == 0) {
    pcVar24 = 
    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20)"
    ;
    uVar11 = 0x12cf;
  }
  else {
    secp256k1_scalar_set_int(sc + 1,0);
    secp256k1_scalar_set_int(sc + 2,0);
    secp256k1_scalar_set_int(sc + 3,0);
    secp256k1_scalar_set_int(sc + 4,0);
    iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                            ecmult_multi_callback,&data,6);
    if (iVar6 == 0) {
      pcVar24 = 
      "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6)"
      ;
      uVar11 = 0x12d4;
    }
    else {
      iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&r,&secp256k1_scalar_zero,
                              ecmult_multi_callback,&data,5);
      if (iVar6 == 0) {
        pcVar24 = 
        "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5)"
        ;
        uVar11 = 0x12d5;
      }
      else {
        iVar6 = secp256k1_gej_is_infinity(&r);
        if (iVar6 != 0) {
          testutil_random_ge_test(&ptg_4);
          secp256k1_gej_set_ge(&ptgj,&ptg_4);
          uVar16 = 0;
          do {
            if (uVar16 == 8) {
              return;
            }
            uVar1 = uVar16 + 1;
            uVar12 = (uint)uVar16;
            uVar26 = 0;
            while (uVar16 = uVar1, uVar26 != 8) {
              secp256k1_scalar_set_int(&t0,(uint)(uVar1 >> 1));
              secp256k1_scalar_cond_negate(&t0,uVar12 & 1);
              uVar16 = uVar26 + 1;
              secp256k1_scalar_set_int(&t1,(uint)(uVar16 >> 1));
              secp256k1_scalar_cond_negate(&t1,(uint)uVar26 & 1);
              secp256k1_ecmult((secp256k1_gej *)&ptg,&ptgj,&t0,&secp256k1_scalar_zero);
              secp256k1_ecmult((secp256k1_gej *)&rs,&ptgj,&t1,&secp256k1_scalar_zero);
              uVar17 = 0;
              while (uVar26 = uVar16, uVar17 != 8) {
                uVar26 = uVar17 + 1;
                uVar13 = (uint)uVar17;
                uVar27 = 0;
                while (uVar17 = uVar26, uVar27 != 8) {
                  secp256k1_ge_set_gej(pt,(secp256k1_gej *)&ptg);
                  secp256k1_ge_set_gej(pt + 1,(secp256k1_gej *)&rs);
                  secp256k1_scalar_set_int(sc,(uint)(uVar26 >> 1));
                  secp256k1_scalar_cond_negate(sc,uVar13 & 1);
                  psVar15 = sc + 1;
                  secp256k1_scalar_set_int(psVar15,(uint)(uVar27 + 1 >> 1));
                  secp256k1_scalar_cond_negate(psVar15,(uint)uVar27 & 1);
                  secp256k1_scalar_mul(&tmp1,&t0,sc);
                  secp256k1_scalar_mul(&tmp2,&t1,psVar15);
                  secp256k1_scalar_add(&tmp1,&tmp1,&tmp2);
                  secp256k1_ecmult(&expected,&ptgj,&tmp1,&secp256k1_scalar_zero);
                  iVar6 = (*ecmult_multi)(&CTX->error_callback,scratch,&actual,
                                          &secp256k1_scalar_zero,ecmult_multi_callback,&data,2);
                  if (iVar6 == 0) {
                    pcVar24 = 
                    "test condition failed: ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2)"
                    ;
                    uVar11 = 0x1302;
                    goto LAB_0013c255;
                  }
                  iVar6 = secp256k1_gej_eq_var(&actual,&expected);
                  uVar27 = uVar27 + 1;
                  if (iVar6 == 0) {
                    pcVar24 = "test condition failed: secp256k1_gej_eq_var(&actual, &expected)";
                    uVar11 = 0x1303;
                    goto LAB_0013c255;
                  }
                }
              }
            }
          } while( true );
        }
        pcVar24 = "test condition failed: secp256k1_gej_is_infinity(&r)";
        uVar11 = 0x12d6;
      }
    }
  }
  goto LAB_0013c255;
}

Assistant:

static void test_ecmult_multi(secp256k1_scratch *scratch, secp256k1_ecmult_multi_func ecmult_multi) {
    int ncount;
    secp256k1_scalar sc[32];
    secp256k1_ge pt[32];
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;

    data.sc = sc;
    data.pt = pt;

    /* No points to multiply */
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0));

    /* Check 1- and 2-point multiplies against ecmult */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        testutil_random_scalar_order(&sc[0]);
        testutil_random_scalar_order(&sc[1]);

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[0] = ptg;
        pt[1] = secp256k1_ge_const_g;

        /* only G scalar */
        secp256k1_ecmult(&r2, &ptgj, &secp256k1_scalar_zero, &sc[0]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 1-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* Try to multiply 1 point, but callback returns false */
        CHECK(!ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1));

        /* 2-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 2-point with G scalar */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check infinite outputs of various forms */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        size_t i, j;
        size_t sizes[] = { 2, 10, 32 };

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_scalar_order(&sc[i]);
                secp256k1_ge_set_infinity(&pt[i]);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_ge_test(&ptg);
                pt[i] = ptg;
                secp256k1_scalar_set_int(&sc[i], 0);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            testutil_random_ge_test(&ptg);
            for (i = 0; i < 16; i++) {
                testutil_random_scalar_order(&sc[2*i]);
                secp256k1_scalar_negate(&sc[2*i + 1], &sc[2*i]);
                pt[2 * i] = ptg;
                pt[2 * i + 1] = ptg;
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));

            testutil_random_scalar_order(&sc[0]);
            for (i = 0; i < 16; i++) {
                testutil_random_ge_test(&ptg);

                sc[2*i] = sc[0];
                sc[2*i+1] = sc[0];
                pt[2 * i] = ptg;
                secp256k1_ge_neg(&pt[2*i+1], &pt[2*i]);
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        testutil_random_ge_test(&ptg);
        secp256k1_scalar_set_int(&sc[0], 0);
        pt[0] = ptg;
        for (i = 1; i < 32; i++) {
            pt[i] = ptg;

            testutil_random_scalar_order(&sc[i]);
            secp256k1_scalar_add(&sc[0], &sc[0], &sc[i]);
            secp256k1_scalar_negate(&sc[i], &sc[i]);
        }

        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32));
        CHECK(secp256k1_gej_is_infinity(&r));
    }

    /* Check random points, constant scalar */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_gej_set_infinity(&r);

        testutil_random_scalar_order(&sc[0]);
        for (i = 0; i < 20; i++) {
            secp256k1_ge ptg;
            sc[i] = sc[0];
            testutil_random_ge_test(&ptg);
            pt[i] = ptg;
            secp256k1_gej_add_ge_var(&r, &r, &pt[i], NULL);
        }

        secp256k1_ecmult(&r2, &r, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check random scalars, constant point */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_ge ptg;
        secp256k1_gej p0j;
        secp256k1_scalar rs;
        secp256k1_scalar_set_int(&rs, 0);

        testutil_random_ge_test(&ptg);
        for (i = 0; i < 20; i++) {
            testutil_random_scalar_order(&sc[i]);
            pt[i] = ptg;
            secp256k1_scalar_add(&rs, &rs, &sc[i]);
        }

        secp256k1_gej_set_ge(&p0j, &pt[0]);
        secp256k1_ecmult(&r2, &p0j, &rs, &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Sanity check that zero scalars don't cause problems */
    for (ncount = 0; ncount < 20; ncount++) {
        testutil_random_scalar_order(&sc[ncount]);
        testutil_random_ge_test(&pt[ncount]);
    }

    secp256k1_scalar_set_int(&sc[0], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
    secp256k1_scalar_set_int(&sc[1], 0);
    secp256k1_scalar_set_int(&sc[2], 0);
    secp256k1_scalar_set_int(&sc[3], 0);
    secp256k1_scalar_set_int(&sc[4], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6));
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5));
    CHECK(secp256k1_gej_is_infinity(&r));

    /* Run through s0*(t0*P) + s1*(t1*P) exhaustively for many small values of s0, s1, t0, t1 */
    {
        const size_t TOP = 8;
        size_t s0i, s1i;
        size_t t0i, t1i;
        secp256k1_ge ptg;
        secp256k1_gej ptgj;

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);

        for(t0i = 0; t0i < TOP; t0i++) {
            for(t1i = 0; t1i < TOP; t1i++) {
                secp256k1_gej t0p, t1p;
                secp256k1_scalar t0, t1;

                secp256k1_scalar_set_int(&t0, (t0i + 1) / 2);
                secp256k1_scalar_cond_negate(&t0, t0i & 1);
                secp256k1_scalar_set_int(&t1, (t1i + 1) / 2);
                secp256k1_scalar_cond_negate(&t1, t1i & 1);

                secp256k1_ecmult(&t0p, &ptgj, &t0, &secp256k1_scalar_zero);
                secp256k1_ecmult(&t1p, &ptgj, &t1, &secp256k1_scalar_zero);

                for(s0i = 0; s0i < TOP; s0i++) {
                    for(s1i = 0; s1i < TOP; s1i++) {
                        secp256k1_scalar tmp1, tmp2;
                        secp256k1_gej expected, actual;

                        secp256k1_ge_set_gej(&pt[0], &t0p);
                        secp256k1_ge_set_gej(&pt[1], &t1p);

                        secp256k1_scalar_set_int(&sc[0], (s0i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[0], s0i & 1);
                        secp256k1_scalar_set_int(&sc[1], (s1i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[1], s1i & 1);

                        secp256k1_scalar_mul(&tmp1, &t0, &sc[0]);
                        secp256k1_scalar_mul(&tmp2, &t1, &sc[1]);
                        secp256k1_scalar_add(&tmp1, &tmp1, &tmp2);

                        secp256k1_ecmult(&expected, &ptgj, &tmp1, &secp256k1_scalar_zero);
                        CHECK(ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
                        CHECK(secp256k1_gej_eq_var(&actual, &expected));
                    }
                }
            }
        }
    }
}